

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::computeQuadTexCoord1D
               (vector<float,_std::allocator<float>_> *dst,float left,float right)

{
  reference pvVar1;
  float right_local;
  float left_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  std::vector<float,_std::allocator<float>_>::resize(dst,4);
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  *pvVar1 = left;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  *pvVar1 = left;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  *pvVar1 = right;
  pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  *pvVar1 = right;
  return;
}

Assistant:

void computeQuadTexCoord1D (std::vector<float>& dst, float left, float right)
{
	dst.resize(4);

	dst[0] = left;
	dst[1] = left;
	dst[2] = right;
	dst[3] = right;
}